

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O3

double __thiscall merlin::factor::distance(factor *this,factor *F2,Distance type)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  double *pdVar4;
  long lVar5;
  runtime_error *this_00;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  factor F;
  factor Ftmp;
  factor local_e0;
  factor local_80;
  
  bVar3 = variable_set::operator==(&this->v_,&F2->v_);
  if (!bVar3) {
    __assert_fail("vars() == F2.vars()",
                  "/workspace/llm4binary/github/license_c_cmakelists/radum2275[P]merlin/include/factor.h"
                  ,0x4c7,"double merlin::factor::distance(const factor &, Distance) const");
  }
  factor(&local_e0,this);
  factor(&local_80,1.0);
  pdVar6 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  switch(type.t_) {
  case L1:
    binaryOpIP<merlin::factor::binOpMinus>(&local_e0,F2);
    pdVar4 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        *pdVar4 = ABS(*pdVar4);
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 != local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      dVar9 = 0.0;
      do {
        dVar9 = dVar9 + *local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      } while (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
      break;
    }
    goto LAB_00159766;
  case L2:
    binaryOpIP<merlin::factor::binOpMinus>(&local_e0,F2);
    binaryOpIP<merlin::factor::binOpTimes>(&local_e0,&local_e0);
    if (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar9 = 0.0;
      do {
        dVar9 = dVar9 + *local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      } while (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
      break;
    }
    goto LAB_00159766;
  case LInf:
    binaryOpIP<merlin::factor::binOpMinus>(&local_e0,F2);
    pdVar4 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar9 = -INFINITY;
    }
    else {
      do {
        *pdVar4 = ABS(*pdVar4);
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 != local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      dVar9 = -INFINITY;
      do {
        dVar10 = *local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (*local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start <= dVar9) {
          dVar10 = dVar9;
        }
        dVar9 = dVar10;
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      } while (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    break;
  case KL:
    dVar10 = 0.0;
    for (pdVar4 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 != (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
      dVar10 = dVar10 + *pdVar4;
    }
    binaryOpIP<merlin::factor::binOpDivide>(&local_e0,F2);
    pdVar6 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    dVar9 = 0.0;
    for (pdVar4 = (F2->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar4 != (F2->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
      dVar9 = dVar9 + *pdVar4;
    }
    if ((long)local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar5 = (long)local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar8 = 0;
      do {
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar8] =
             local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8] * (dVar9 / dVar10);
        lVar8 = lVar8 + 1;
        pdVar7 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar8);
      do {
        dVar9 = log(*pdVar7);
        *pdVar7 = dVar9;
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 != pdVar6);
    }
    binaryOpIP<merlin::factor::binOpTimes>(&local_e0,this);
    dVar9 = 0.0;
    for (; local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      dVar9 = dVar9 + *local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
    }
    dVar9 = dVar9 / dVar10;
    break;
  case HPM:
    binaryOpIP<merlin::factor::binOpDivide>(&local_e0,F2);
    pdVar6 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    dVar9 = -INFINITY;
    pdVar7 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        dVar9 = log(*pdVar7);
        *pdVar7 = dVar9;
        pdVar7 = pdVar7 + 1;
      } while (pdVar7 != pdVar6);
      dVar9 = -INFINITY;
      if (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pdVar6 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        dVar10 = -INFINITY;
        do {
          dVar9 = *pdVar6;
          if (*pdVar6 <= dVar10) {
            dVar9 = dVar10;
          }
          pdVar6 = pdVar6 + 1;
          dVar10 = dVar9;
        } while (pdVar6 != local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        dVar10 = INFINITY;
        do {
          dVar12 = *local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (dVar10 <= *local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) {
            dVar12 = dVar10;
          }
          local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
          dVar10 = dVar12;
        } while (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start !=
                 local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        dVar9 = dVar9 - dVar12;
      }
    }
    break;
  case MAS:
    for (pdVar7 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar7 != pdVar6; pdVar7 = pdVar7 + 1) {
      dVar9 = log(*pdVar7);
      *pdVar7 = dVar9;
    }
    operator=(&local_80,F2);
    for (; local_80.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start !=
           local_80.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
        local_80.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_80.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1) {
      dVar9 = log(*local_80.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start);
      *local_80.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start = dVar9;
    }
    binaryOpIP<merlin::factor::binOpDivide>(&local_e0,&local_80);
    if (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar12 = INFINITY;
      dVar10 = -INFINITY;
    }
    else {
      pdVar6 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar9 = -INFINITY;
      do {
        dVar10 = *pdVar6;
        if (*pdVar6 <= dVar9) {
          dVar10 = dVar9;
        }
        pdVar6 = pdVar6 + 1;
        dVar9 = dVar10;
      } while (pdVar6 != local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      dVar9 = INFINITY;
      do {
        dVar12 = *local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (dVar9 <= *local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) {
          dVar12 = dVar9;
        }
        local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
        dVar9 = dVar12;
      } while (local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start !=
               local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    dVar9 = 1.0 / dVar12;
    if (1.0 / dVar12 <= dVar10) {
      dVar9 = dVar10;
    }
    dVar9 = dVar9 + -1.0;
    break;
  case OptGap:
    lVar5 = (long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (lVar5 != 0) {
      lVar5 = lVar5 >> 3;
      pdVar6 = (F2->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = 0;
      dVar9 = 0.0;
      dVar10 = 0.0;
      dVar12 = 0.0;
      dVar15 = 0.0;
      do {
        dVar1 = local_e0.t_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar8];
        if (dVar1 <= dVar9) {
          dVar14 = pdVar6[lVar8];
          dVar13 = dVar12;
          if (((dVar9 == dVar1) && (!NAN(dVar9) && !NAN(dVar1))) &&
             (dVar13 = dVar14, dVar12 <= dVar14)) {
            dVar13 = dVar12;
          }
        }
        else {
          dVar14 = pdVar6[lVar8];
          dVar9 = dVar1;
          dVar13 = dVar14;
        }
        dVar11 = dVar1;
        if (dVar14 <= dVar15) {
          bVar3 = NAN(dVar14);
          bVar2 = dVar15 == dVar14;
          dVar11 = dVar10;
          dVar14 = dVar15;
          if (((bVar2) && (!NAN(dVar15) && !bVar3)) && (dVar11 = dVar1, dVar10 <= dVar1)) {
            dVar11 = dVar10;
          }
        }
        lVar8 = lVar8 + 1;
        dVar10 = dVar11;
        dVar12 = dVar13;
        dVar15 = dVar14;
      } while (lVar5 + (ulong)(lVar5 == 0) != lVar8);
      dVar9 = (dVar14 - dVar13) + (dVar9 - dVar11);
      break;
    }
LAB_00159766:
    dVar9 = 0.0;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid distance type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  ~factor(&local_80);
  ~factor(&local_e0);
  return dVar9;
}

Assistant:

double distance(factor const& F2, Distance type = Distance::L2) const {
		assert(vars() == F2.vars());
		factor F(*this), Ftmp;               // make a copy for manipulation
		double dist = -1.0;                   // local variables
		value Z;
		switch (type) {
		case Distance::L2:                // L2, sum of squared errors
			F -= F2;
			F *= F;
			dist = F.sum();
			break;
		case Distance::L1:               // L1, sum of absolute errors  (=TV !!)
			F -= F2;
			dist = F.abs().sum();
			break;
		case Distance::LInf:              // L-infinity, max absolute error
			F -= F2;
			dist = F.abs().max();
			break;
		case Distance::KL:                // KL-divergence (relative entropy)
			Z = sum();
			F /= F2;
			F *= F2.sum() / Z;
			F.log();
			F *= *this;
			dist = F.sum() / Z;
			break;
		case Distance::HPM:               // Hilbert's projective metric
			F /= F2;
			F.log();
			dist = F.max() - F.min(); //   aka "dynamic range"
			break;
		case Distance::MAS:               // "MAS" error value (not a metric)
			F.log();
			Ftmp = F2;
			F /= Ftmp.log();
			dist = std::max(F.max(), 1.0 / F.min()) - 1.0;
			break;
		case Distance::OptGap:            // "Primal/Dual Gap"-like
			double mx1, mx2, gap1, gap2;
			mx1 = mx2 = gap1 = gap2 = 0.0;
			for (size_t i = 0; i < num_states(); ++i) {
				if (mx1 < F[i]) {
					gap2 = F2[i];
					mx1 = F[i];
				} else if (mx1 == F[i])
					gap2 = std::min(gap2, F2[i]);
				if (mx2 < F2[i]) {
					gap1 = F[i];
					mx2 = F2[i];
				} else if (mx2 == F2[i])
					gap1 = std::min(gap1, F[i]);
			}
			return (mx1 - gap1) + (mx2 - gap2);
			break;
			//case Distance::Hellinger:   (!!)
			//  F^=0.5; F-=F2^0.5; F*=F; dist=(0.5*F.sum())^0.5;  // straightforward computation
			//  F*=F2; F^=0.5; dist=(1-F.sum())^0.5;              // alternate computation if F,F2 normalized
			//	break;
		default:
			throw std::runtime_error("Invalid distance type");
		}
		return dist;
	}